

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

void __thiscall
QSynth::setDisplayCompatibilityMode
          (QSynth *this,DisplayCompatibilityMode useDisplayCompatibilityMode)

{
  QMutex *pQVar1;
  Synth *this_00;
  bool bVar2;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::setDisplayCompatibilityMode(this->realtimeHelper,useDisplayCompatibilityMode);
    return;
  }
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::lockInternal();
    }
  }
  this->displayCompatibilityMode = useDisplayCompatibilityMode;
  this_00 = this->synth;
  if (useDisplayCompatibilityMode == DisplayCompatibilityMode_DEFAULT) {
    bVar2 = MT32Emu::Synth::isDefaultDisplayOldMT32Compatible(this_00);
  }
  else {
    bVar2 = useDisplayCompatibilityMode == DisplayCompatibilityMode_OLD_MT32;
  }
  MT32Emu::Synth::setDisplayCompatibility(this_00,bVar2);
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void QSynth::setDisplayCompatibilityMode(DisplayCompatibilityMode useDisplayCompatibilityMode) {
	if (isRealtime()) {
		realtimeHelper->setDisplayCompatibilityMode(useDisplayCompatibilityMode);
	} else {
		QMutexLocker synthLocker(synthMutex);
		displayCompatibilityMode = useDisplayCompatibilityMode;
		if (DisplayCompatibilityMode_DEFAULT == displayCompatibilityMode) {
			synth->setDisplayCompatibility(synth->isDefaultDisplayOldMT32Compatible());
		} else {
			synth->setDisplayCompatibility(DisplayCompatibilityMode_OLD_MT32 == displayCompatibilityMode);
		}
	}
}